

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::RandomFragmentOpCase::iterate(RandomFragmentOpCase *this)

{
  QuadRenderer *renderer;
  ReferenceQuadRenderer *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int height_00;
  int iVar6;
  int iVar7;
  GLenum GVar8;
  uint r;
  uint g;
  uint b;
  uint a;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  CommandLine *this_01;
  TestLog *pTVar11;
  pointer pRVar12;
  MessageBuilder *pMVar13;
  float red;
  float green;
  float blue;
  float alpha;
  char (*local_9d8) [10];
  MessageBuilder local_820;
  ConstPixelBufferAccess local_6a0;
  ConstPixelBufferAccess local_678;
  RGBA local_64c;
  ConstPixelBufferAccess local_648;
  ConstPixelBufferAccess local_620;
  bool local_5f5;
  undefined1 local_5f4 [7];
  bool compareOk;
  UVec4 threshold;
  bool isLastIter;
  PixelBufferAccess local_5b8;
  PixelBufferAccess local_590;
  RenderCommand *local_568;
  PixelBufferAccess local_560;
  PixelBufferAccess local_538;
  PixelBufferAccess local_510;
  PixelBufferAccess local_4e8;
  PixelBufferAccess local_4c0;
  PixelBufferAccess local_498;
  undefined1 local_470 [8];
  FragmentOperationState refState;
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_3c8;
  __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_3c0;
  const_iterator cmd_1;
  PixelBufferAccess local_390;
  PixelBufferAccess local_368;
  RenderCommand *local_340;
  MessageBuilder local_338;
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_1b8;
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_1b0;
  __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
  local_1a8;
  const_iterator cmd;
  undefined1 local_198 [8];
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  commands;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ScopedLogSection local_b0;
  ScopedLogSection iterSection;
  bool gotError;
  int clearStencil;
  float clearDepth;
  Vec4 clearColor;
  Surface referenceImg;
  Surface renderedImg;
  int viewportY;
  int viewportX;
  int height;
  undefined1 local_38 [4];
  int width;
  Random rnd;
  deUint32 iterSeed;
  bool isMSAA;
  Functions *gl;
  RandomFragmentOpCase *this_local;
  Functions *gl_00;
  
  pRVar9 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar9->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getNumSamples(pRVar10);
  rnd.m_rnd.w._3_1_ = 1 < iVar2;
  dVar3 = deUint32Hash(this->m_seed);
  dVar4 = ::deInt32Hash(this->m_iterNdx);
  this_01 = tcu::TestContext::getCommandLine
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar2 = tcu::CommandLine::getBaseSeed(this_01);
  dVar5 = ::deInt32Hash(iVar2);
  rnd.m_rnd.z = dVar3 ^ dVar4 ^ dVar5;
  de::Random::Random((Random *)local_38,rnd.m_rnd.z);
  iVar2 = tcu::TextureLevel::getWidth(this->m_refColorBuffer);
  height_00 = tcu::TextureLevel::getHeight(this->m_refColorBuffer);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = tcu::RenderTarget::getWidth(pRVar10);
  iVar6 = de::Random::getInt((Random *)local_38,0,iVar6 - iVar2);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = tcu::RenderTarget::getHeight(pRVar10);
  iVar7 = de::Random::getInt((Random *)local_38,0,iVar7 - height_00);
  tcu::Surface::Surface((Surface *)&referenceImg.m_pixels.m_cap,iVar2,height_00);
  tcu::Surface::Surface((Surface *)(clearColor.m_data + 2),iVar2,height_00);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&clearStencil,(Vector<float,_4> *)CLEAR_COLOR);
  iterSection.m_log._7_1_ = 0;
  pTVar11 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Iteration",&local_f1);
  de::toString<int>(&local_118,&this->m_iterNdx);
  std::operator+(&local_d0,&local_f0,&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Iteration ",&local_159);
  de::toString<int>((string *)
                    &commands.
                     super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_iterNdx);
  std::operator+(&local_138,&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &commands.
                  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::ScopedLogSection(&local_b0,pTVar11,&local_d0,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string
            ((string *)
             &commands.
              super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ::vector((vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
            *)local_198);
  cmd._M_current._4_4_ = glu::ApiType::es(3,0);
  deqp::gls::InteractionTestUtil::computeRandomRenderCommands
            ((Random *)local_38,cmd._M_current._4_4_,3,iVar2,height_00,
             (vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
              *)local_198);
  (*gl_00->disable)(0xc11);
  (*gl_00->colorMask)('\x01','\x01','\x01','\x01');
  (*gl_00->depthMask)('\x01');
  (*gl_00->stencilMask)(0xffffffff);
  red = tcu::Vector<float,_4>::x((Vector<float,_4> *)&clearStencil);
  green = tcu::Vector<float,_4>::y((Vector<float,_4> *)&clearStencil);
  blue = tcu::Vector<float,_4>::z((Vector<float,_4> *)&clearStencil);
  alpha = tcu::Vector<float,_4>::w((Vector<float,_4> *)&clearStencil);
  glu::CallLogWrapper::glClearColor(&this->m_callLogWrapper,red,green,blue,alpha);
  glu::CallLogWrapper::glClearDepthf(&this->m_callLogWrapper,1.0);
  glu::CallLogWrapper::glClearStencil(&this->m_callLogWrapper,0);
  glu::CallLogWrapper::glClear(&this->m_callLogWrapper,0x4500);
  glu::CallLogWrapper::glViewport(&this->m_callLogWrapper,iVar6,iVar7,iVar2,height_00);
  local_1b0._M_current =
       (RenderCommand *)
       std::
       vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
       ::begin((vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                *)local_198);
  __gnu_cxx::
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_const*,std::vector<deqp::gls::InteractionTestUtil::RenderCommand,std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>>>
  ::__normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand*>
            ((__normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_const*,std::vector<deqp::gls::InteractionTestUtil::RenderCommand,std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>>>
              *)&local_1a8,&local_1b0);
  while( true ) {
    local_1b8._M_current =
         (RenderCommand *)
         std::
         vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
         ::end((vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                *)local_198);
    bVar1 = __gnu_cxx::operator!=(&local_1a8,&local_1b8);
    if (!bVar1) break;
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    setGLState(&this->m_callLogWrapper,&pRVar12->state,iVar6,iVar7);
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_338,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [10])"// Quad: ");
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(Vector<int,_2> *)pRVar12);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [5])" -> ");
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&(pRVar12->quad).posB);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [11])", color: [");
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).color);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x12ed2ef);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).color + 1);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x12ed2ef);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).color + 2);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x12ed2ef);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).color + 3);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x12a9f4e);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [11])", depth: [");
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).depth);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x12ed2ef);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).depth + 1);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x12ed2ef);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).depth + 2);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [3])0x12ed2ef);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(pRVar12->quad).depth + 3);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x12a9f4e);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_338);
    renderer = this->m_renderer;
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_1a8);
    renderQuad(gl_00,renderer,&pRVar12->quad,iVar6,iVar7);
    local_340 = (RenderCommand *)
                __gnu_cxx::
                __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
                ::operator++(&local_1a8,0);
  }
  GVar8 = glu::CallLogWrapper::glGetError(&this->m_callLogWrapper);
  if (GVar8 != 0) {
    iterSection.m_log._7_1_ = 1;
  }
  (*gl_00->flush)();
  tcu::TextureLevel::getAccess(&local_368,this->m_refColorBuffer);
  tcu::clear(&local_368,(Vec4 *)&clearStencil);
  tcu::TextureLevel::getAccess(&local_390,this->m_refDepthBuffer);
  tcu::clearDepth(&local_390,1.0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&cmd_1,this->m_refStencilBuffer);
  tcu::clearStencil((PixelBufferAccess *)&cmd_1,0);
  local_3c8._M_current =
       (RenderCommand *)
       std::
       vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
       ::begin((vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                *)local_198);
  __gnu_cxx::
  __normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_const*,std::vector<deqp::gls::InteractionTestUtil::RenderCommand,std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>>>
  ::__normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand*>
            ((__normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_const*,std::vector<deqp::gls::InteractionTestUtil::RenderCommand,std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>>>
              *)&local_3c0,&local_3c8);
  while( true ) {
    refState._152_8_ =
         std::
         vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
         ::end((vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                *)local_198);
    bVar1 = __gnu_cxx::operator!=
                      (&local_3c0,
                       (__normal_iterator<deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
                        *)&refState.colorMask);
    if (!bVar1) break;
    rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_470);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_3c0);
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    translateState(&pRVar12->state,(FragmentOperationState *)local_470,pRVar10);
    this_00 = this->m_refRenderer;
    tcu::TextureLevel::getAccess(&local_4c0,this->m_refColorBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_498,&local_4c0);
    tcu::TextureLevel::getAccess(&local_510,this->m_refDepthBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_4e8,&local_510);
    tcu::TextureLevel::getAccess(&local_560,this->m_refStencilBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_538,&local_560);
    pRVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
              ::operator->(&local_3c0);
    deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
              (this_00,&local_498,&local_4e8,&local_538,&pRVar12->quad,
               (FragmentOperationState *)local_470);
    local_568 = (RenderCommand *)
                __gnu_cxx::
                __normal_iterator<const_deqp::gls::InteractionTestUtil::RenderCommand_*,_std::vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>_>
                ::operator++(&local_3c0,0);
  }
  tcu::Surface::getAccess(&local_590,(Surface *)(clearColor.m_data + 2));
  tcu::TextureLevel::getAccess(&local_5b8,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_590,(EVP_PKEY_CTX *)&local_5b8);
  pRVar9 = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)(threshold.m_data + 3),(Surface *)&referenceImg.m_pixels.m_cap);
  glu::readPixels(pRVar9,iVar6,iVar7,(PixelBufferAccess *)(threshold.m_data + 3));
  this->m_iterNdx = this->m_iterNdx + 1;
  threshold.m_data[2]._3_1_ = 9 < this->m_iterNdx;
  getCompareThreshold((RandomFragmentOpCase *)local_5f4);
  if ((rnd.m_rnd.w._3_1_ & 1) == 0) {
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_678,(Surface *)(clearColor.m_data + 2));
    tcu::Surface::getAccess((PixelBufferAccess *)&local_6a0,(Surface *)&referenceImg.m_pixels.m_cap)
    ;
    local_5f5 = tcu::intThresholdCompare
                          (pTVar11,"CompareResult","Image Comparison Result",&local_678,&local_6a0,
                           (UVec4 *)local_5f4,COMPARE_LOG_RESULT);
  }
  else {
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_620,(Surface *)(clearColor.m_data + 2));
    tcu::Surface::getAccess((PixelBufferAccess *)&local_648,(Surface *)&referenceImg.m_pixels.m_cap)
    ;
    r = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_5f4);
    g = tcu::Vector<unsigned_int,_4>::y((Vector<unsigned_int,_4> *)local_5f4);
    b = tcu::Vector<unsigned_int,_4>::z((Vector<unsigned_int,_4> *)local_5f4);
    a = tcu::Vector<unsigned_int,_4>::w((Vector<unsigned_int,_4> *)local_5f4);
    tcu::RGBA::RGBA(&local_64c,r,g,b,a);
    local_5f5 = tcu::bilinearCompare
                          (pTVar11,"CompareResult","Image Comparison Result",&local_620,&local_648,
                           local_64c,COMPARE_LOG_RESULT);
  }
  pTVar11 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_820,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  if ((local_5f5 & 1U) == 0) {
    local_9d8 = (char (*) [10])0x1283bc4;
  }
  else {
    local_9d8 = (char (*) [10])0x1283bba;
  }
  pMVar13 = tcu::MessageBuilder::operator<<(&local_820,local_9d8);
  tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_820);
  if ((local_5f5 & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  else if ((iterSection.m_log._7_1_ & 1) != 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "GL error");
  }
  if ((((local_5f5 & 1U) == 0) || ((iterSection.m_log._7_1_ & 1) != 0)) ||
     ((threshold.m_data[2]._3_1_ & 1) != 0)) {
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = CONTINUE;
  }
  std::
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ::~vector((vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
             *)local_198);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b0);
  tcu::Surface::~Surface((Surface *)(clearColor.m_data + 2));
  tcu::Surface::~Surface((Surface *)&referenceImg.m_pixels.m_cap);
  de::Random::~Random((Random *)local_38);
  return this_local._4_4_;
}

Assistant:

RandomFragmentOpCase::IterateResult RandomFragmentOpCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				isMSAA			= m_context.getRenderTarget().getNumSamples() > 1;
	const deUint32			iterSeed		= deUint32Hash(m_seed) ^ deInt32Hash(m_iterNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed());
	de::Random				rnd				(iterSeed);

	const int				width			= m_refColorBuffer->getWidth();
	const int				height			= m_refColorBuffer->getHeight();
	const int				viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
	const int				viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

	tcu::Surface			renderedImg		(width, height);
	tcu::Surface			referenceImg	(width, height);

	const Vec4				clearColor		= CLEAR_COLOR;
	const float				clearDepth		= CLEAR_DEPTH;
	const int				clearStencil	= CLEAR_STENCIL;

	bool					gotError		= false;

	const tcu::ScopedLogSection	iterSection	(m_testCtx.getLog(), std::string("Iteration") + de::toString(m_iterNdx), std::string("Iteration ") + de::toString(m_iterNdx));

	// Compute randomized rendering commands.
	vector<RenderCommand> commands;
	computeRandomRenderCommands(rnd, glu::ApiType::es(3,0), NUM_CALLS_PER_ITERATION, width, height, commands);

	// Reset default fragment state.
	gl.disable(GL_SCISSOR_TEST);
	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.depthMask(GL_TRUE);
	gl.stencilMask(~0u);

	// Render using GL.
	m_callLogWrapper.glClearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	m_callLogWrapper.glClearDepthf(clearDepth);
	m_callLogWrapper.glClearStencil(clearStencil);
	m_callLogWrapper.glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_callLogWrapper.glViewport(viewportX, viewportY, width, height);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		setGLState(m_callLogWrapper, cmd->state, viewportX, viewportY);

		if (ENABLE_CALL_LOG)
			m_testCtx.getLog() << TestLog::Message << "// Quad: " << cmd->quad.posA << " -> " << cmd->quad.posB
												   << ", color: [" << cmd->quad.color[0] << ", " << cmd->quad.color[1] << ", " << cmd->quad.color[2] << ", " << cmd->quad.color[3] << "]"
												   << ", depth: [" << cmd->quad.depth[0] << ", " << cmd->quad.depth[1] << ", " << cmd->quad.depth[2] << ", " << cmd->quad.depth[3] << "]"
								<< TestLog::EndMessage;

		renderQuad(gl, *m_renderer, cmd->quad, viewportX, viewportY);
	}

	// Check error.
	if (m_callLogWrapper.glGetError() != GL_NO_ERROR)
		gotError = true;

	gl.flush();

	// Render reference while GPU is doing work.
	tcu::clear			(m_refColorBuffer->getAccess(),		clearColor);
	tcu::clearDepth		(m_refDepthBuffer->getAccess(),		clearDepth);
	tcu::clearStencil	(m_refStencilBuffer->getAccess(),	clearStencil);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		rr::FragmentOperationState refState;
		translateState(cmd->state, refState, m_context.getRenderTarget());
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  cmd->quad, refState);
	}

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	const bool			isLastIter	= m_iterNdx >= NUM_ITERATIONS_PER_CASE;
	const tcu::UVec4	threshold	= getCompareThreshold();
	bool				compareOk;

	if (isMSAA)
	{
		// in MSAA cases, the sampling points could be anywhere in the pixel and we could
		// even have multiple samples that are combined in resolve. Allow arbitrary sample
		// positions by using bilinearCompare.
		compareOk = tcu::bilinearCompare(m_testCtx.getLog(),
										 "CompareResult",
										 "Image Comparison Result",
										 referenceImg.getAccess(),
										 renderedImg.getAccess(),
										 tcu::RGBA(threshold.x(), threshold.y(), threshold.z(), threshold.w()),
										 tcu::COMPARE_LOG_RESULT);
	}
	else
		compareOk = tcu::intThresholdCompare(m_testCtx.getLog(),
											 "CompareResult",
											 "Image Comparison Result",
											 referenceImg.getAccess(),
											 renderedImg.getAccess(),
											 threshold,
											 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;

	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	else if (gotError)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL error");

	if (compareOk && !gotError && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}